

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_serializer.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
net_serializer<std::vector<double,_std::allocator<double>_>,_void>::deserialize
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,istream *in)

{
  pointer pdVar1;
  undefined1 uVar2;
  vector<double,_std::allocator<double>_> *__range2;
  size_t i_2;
  size_t i;
  long lVar3;
  pointer pdVar4;
  uint8_t buf [4];
  uint8_t buf_1 [8];
  allocator_type local_35;
  int local_34;
  double local_30;
  
  lVar3 = 0;
  do {
    uVar2 = std::istream::get();
    *(undefined1 *)((long)&local_34 + lVar3) = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)local_34,&local_35);
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar4 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start; pdVar4 != pdVar1; pdVar4 = pdVar4 + 1) {
    lVar3 = 0;
    do {
      uVar2 = std::istream::get();
      *(undefined1 *)((long)&local_30 + lVar3) = uVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    *pdVar4 = local_30;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> deserialize(std::istream& in){
        int size = net_serializer<int>::deserialize(in);
        std::vector<T> data(size);
        for (auto& i:data)
            i = net_serializer<T>::deserialize(in);
        return data;
    }